

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_long,unsigned_long>
          (Thread *this,BinopFunc<unsigned_long,_unsigned_long> *f)

{
  unsigned_long uVar1;
  u8 i;
  long lVar2;
  Simd<unsigned_long,_(unsigned_char)__x02_> SVar3;
  SR result;
  Simd<unsigned_long,_(unsigned_char)__x02_> lhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> rhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> local_48;
  unsigned_long local_38 [2];
  unsigned_long local_28 [2];
  
  local_28 = (unsigned_long  [2])Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    uVar1 = (*f)(local_38[lVar2],local_28[lVar2]);
    local_48.v[lVar2] = uVar1;
  }
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}